

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O1

void __thiscall
stateObservation::IndexedMatrixArray::setValue(IndexedMatrixArray *this,Matrix *v,uint k)

{
  uint uVar1;
  ActualDstType actualDst;
  long lVar2;
  reference dst;
  ulong uVar3;
  assign_op<double,_double> local_9;
  
  lVar2 = (*(long *)(this + 0x28) - *(long *)(this + 0x18) >> 3) * -0x5555555555555555 +
          (*(long *)(this + 0x38) - *(long *)(this + 0x40) >> 3) * -0x5555555555555555 +
          ((*(long *)(this + 0x50) - *(long *)(this + 0x30) >> 3) + -1 +
          (ulong)(*(long *)(this + 0x50) == 0)) * 0x15;
  if (lVar2 != 0) {
    uVar3 = (ulong)k;
    if ((*(uint *)this <= k) && (uVar3 < (ulong)*(uint *)this + lVar2)) {
      if (lVar2 != 0) {
        uVar1 = *(uint *)this;
        if ((uVar1 <= k) && (uVar3 < lVar2 + (ulong)uVar1)) {
          dst = std::
                _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                              *)(this + 0x18),(ulong)(k - uVar1));
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                    (dst,v,&local_9);
          return;
        }
      }
      __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                    ,0x9b,"void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
    }
    if ((lVar2 != 0) && (lVar2 + (ulong)*(uint *)this != uVar3)) {
      __assert_fail("(v_.size()==0 || k_+v_.size() == time )&& \"Error: New time instants must be consecutive to existing ones\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                    ,0xaa,
                    "void stateObservation::IndexedMatrixArray::checkNext_(unsigned int) const");
    }
  }
  if ((*(long *)(this + 0x38) - *(long *)(this + 0x40) >> 3) * -0x5555555555555555 +
      ((*(long *)(this + 0x50) - *(long *)(this + 0x30) >> 3) + -1 +
      (ulong)(*(long *)(this + 0x50) == 0)) * 0x15 ==
      (*(long *)(this + 0x28) - *(long *)(this + 0x18) >> 3) * 0x5555555555555555) {
    *(uint *)this = k;
  }
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)(this + 8),v);
  return;
}

Assistant:

void IndexedMatrixArray::setValue(const Matrix& v,unsigned k)
{
    if (checkIndex(k))
    {
        (*this)[k]=v;
    }
    else
    {
        checkNext_(k);
        if (v_.size()==0)
            k_=k;

        v_.push_back(v);
    }
}